

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Suitable __thiscall
vkb::PhysicalDeviceSelector::is_device_suitable(PhysicalDeviceSelector *this,PhysicalDevice *pd)

{
  VkSurfaceKHR *ts_1;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *families;
  PreferredDeviceType PVar1;
  PreferredDeviceType PVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  VkResult VVar10;
  VkResult VVar11;
  Suitable SVar12;
  long lVar13;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> formats;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required_extensions_supported;
  
  if (((this->criteria).name._M_string_length != 0) &&
     (bVar3 = std::operator!=(&(this->criteria).name,(pd->properties).deviceName), bVar3)) {
    return no;
  }
  if ((pd->properties).apiVersion < (this->criteria).required_version) {
    return no;
  }
  families = &pd->queue_families;
  uVar5 = detail::get_dedicated_queue_index(families,2,4);
  uVar6 = detail::get_dedicated_queue_index(families,4,2);
  uVar7 = detail::get_separate_queue_index(families,2,4);
  uVar8 = detail::get_separate_queue_index(families,4,2);
  uVar9 = detail::get_present_queue_index
                    (pd->physical_device,(this->instance_info).surface,families);
  if ((uVar5 == 0xffffffff) && ((this->criteria).require_dedicated_compute_queue != false)) {
    return no;
  }
  if (((this->criteria).require_dedicated_transfer_queue & uVar6 == 0xffffffff) != 0) {
    return no;
  }
  if ((uVar7 == 0xffffffff & (this->criteria).require_separate_compute_queue) != 0) {
    return no;
  }
  if ((uVar8 == 0xffffffff & (this->criteria).require_separate_transfer_queue) != 0) {
    return no;
  }
  if (((uVar9 == 0xffffffff) && ((this->criteria).require_present != false)) &&
     ((this->criteria).defer_surface_initialization != true)) {
    return no;
  }
  detail::check_device_extension_support
            (&required_extensions_supported,&pd->available_extensions,
             &(this->criteria).required_extensions);
  SVar12 = no;
  if ((long)required_extensions_supported.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)required_extensions_supported.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)(this->criteria).required_extensions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->criteria).required_extensions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    if (((this->criteria).defer_surface_initialization == false) &&
       ((this->criteria).require_present == true)) {
      ts_1 = &(this->instance_info).surface;
      formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VVar10 = detail::
               get_vector<VkSurfaceFormatKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkSurfaceFormatKHR*),VkPhysicalDevice_T*const&,VkSurfaceKHR_T*const&>
                         (&formats,(_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkSurfaceFormatKHR_ptr
                                    **)(detail::vulkan_functions()::v + 0xd8),&pd->physical_device,
                          ts_1);
      VVar11 = detail::
               get_vector<VkPresentModeKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*),VkPhysicalDevice_T*const&,VkSurfaceKHR_T*const&>
                         (&present_modes,
                          (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                           **)(detail::vulkan_functions()::v + 0xe0),&pd->physical_device,ts_1);
      if ((VVar11 != VK_SUCCESS || VVar10 != VK_SUCCESS) ||
         ((formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_finish ||
          (present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
           _M_impl.super__Vector_impl_data._M_finish)))) {
        std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base
                  (&present_modes.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>);
        std::_Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~_Vector_base
                  (&formats.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>);
        goto LAB_0011bbc9;
      }
      std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base
                (&present_modes.
                  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>);
      std::_Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~_Vector_base
                (&formats.
                  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>);
    }
    bVar3 = (this->criteria).allow_any_type;
    PVar1 = (this->criteria).preferred_type;
    PVar2 = (pd->properties).deviceType;
    bVar4 = detail::supports_features
                      (&pd->features,&(this->criteria).required_features,
                       &pd->extended_features_chain,&(this->criteria).extended_features_chain);
    if (bVar4) {
      for (lVar13 = 0; (ulong)(pd->memory_properties).memoryHeapCount << 4 != lVar13;
          lVar13 = lVar13 + 0x10) {
        if (((*(byte *)((long)&(pd->memory_properties).memoryHeaps[0].flags + lVar13) & 1) != 0) &&
           (*(ulong *)((long)&(pd->memory_properties).memoryHeaps[0].size + lVar13) <
            (this->criteria).required_mem_size)) goto LAB_0011bbc9;
      }
      SVar12 = (Suitable)(byte)(~bVar3 & PVar2 != PVar1);
    }
  }
LAB_0011bbc9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&required_extensions_supported);
  return SVar12;
}

Assistant:

PhysicalDevice::Suitable PhysicalDeviceSelector::is_device_suitable(PhysicalDevice const& pd) const {
    PhysicalDevice::Suitable suitable = PhysicalDevice::Suitable::yes;

    if (criteria.name.size() > 0 && criteria.name != pd.properties.deviceName) return PhysicalDevice::Suitable::no;

    if (criteria.required_version > pd.properties.apiVersion) return PhysicalDevice::Suitable::no;

    bool dedicated_compute = detail::get_dedicated_queue_index(pd.queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT) !=
                             detail::QUEUE_INDEX_MAX_VALUE;
    bool dedicated_transfer = detail::get_dedicated_queue_index(pd.queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT) !=
                              detail::QUEUE_INDEX_MAX_VALUE;
    bool separate_compute = detail::get_separate_queue_index(pd.queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT) !=
                            detail::QUEUE_INDEX_MAX_VALUE;
    bool separate_transfer = detail::get_separate_queue_index(pd.queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT) !=
                             detail::QUEUE_INDEX_MAX_VALUE;

    bool present_queue = detail::get_present_queue_index(pd.physical_device, instance_info.surface, pd.queue_families) !=
                         detail::QUEUE_INDEX_MAX_VALUE;

    if (criteria.require_dedicated_compute_queue && !dedicated_compute) return PhysicalDevice::Suitable::no;
    if (criteria.require_dedicated_transfer_queue && !dedicated_transfer) return PhysicalDevice::Suitable::no;
    if (criteria.require_separate_compute_queue && !separate_compute) return PhysicalDevice::Suitable::no;
    if (criteria.require_separate_transfer_queue && !separate_transfer) return PhysicalDevice::Suitable::no;
    if (criteria.require_present && !present_queue && !criteria.defer_surface_initialization)
        return PhysicalDevice::Suitable::no;

    auto required_extensions_supported =
        detail::check_device_extension_support(pd.available_extensions, criteria.required_extensions);
    if (required_extensions_supported.size() != criteria.required_extensions.size())
        return PhysicalDevice::Suitable::no;

    if (!criteria.defer_surface_initialization && criteria.require_present) {
        std::vector<VkSurfaceFormatKHR> formats;
        std::vector<VkPresentModeKHR> present_modes;

        auto formats_ret = detail::get_vector<VkSurfaceFormatKHR>(formats,
            detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceFormatsKHR,
            pd.physical_device,
            instance_info.surface);
        auto present_modes_ret = detail::get_vector<VkPresentModeKHR>(present_modes,
            detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfacePresentModesKHR,
            pd.physical_device,
            instance_info.surface);

        if (formats_ret != VK_SUCCESS || present_modes_ret != VK_SUCCESS || formats.empty() || present_modes.empty()) {
            return PhysicalDevice::Suitable::no;
        }
    }

    if (!criteria.allow_any_type && pd.properties.deviceType != static_cast<VkPhysicalDeviceType>(criteria.preferred_type)) {
        suitable = PhysicalDevice::Suitable::partial;
    }

    bool required_features_supported = detail::supports_features(
        pd.features, criteria.required_features, pd.extended_features_chain, criteria.extended_features_chain);
    if (!required_features_supported) return PhysicalDevice::Suitable::no;

    for (uint32_t i = 0; i < pd.memory_properties.memoryHeapCount; i++) {
        if (pd.memory_properties.memoryHeaps[i].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) {
            if (pd.memory_properties.memoryHeaps[i].size < criteria.required_mem_size) {
                return PhysicalDevice::Suitable::no;
            }
        }
    }

    return suitable;
}